

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

bool DoesCodecProduceOriginals
               (WirehairCodec decoder,uint N,uint blockBytes,uint finalBytes,uint8_t *message,
               uint8_t *decodedMessage,uint messageBytes)

{
  WirehairResult WVar1;
  int iVar2;
  ostream *poVar3;
  ulong __n;
  ulong uVar4;
  char *pcVar5;
  uint8_t *__s1;
  uint32_t recoveredBytes;
  uint32_t local_44;
  ulong local_40;
  uint8_t *local_38;
  
  uVar4 = (ulong)messageBytes;
  decodedMessage[uVar4] = 0xee;
  local_38 = message;
  WVar1 = wirehair_recover(decoder,decodedMessage,uVar4);
  if (WVar1 == Wirehair_Success) {
    iVar2 = bcmp(local_38,decodedMessage,uVar4);
    if (iVar2 == 0) {
      if (decodedMessage[uVar4] == 0xee) {
        local_40 = (ulong)finalBytes;
        uVar4 = 0;
        __s1 = local_38;
        while( true ) {
          if (N == uVar4) {
            return true;
          }
          decodedMessage[local_40] = 0xee;
          local_44 = 0;
          WVar1 = wirehair_recover_block(decoder,(uint)uVar4,decodedMessage,&local_44);
          if (WVar1 != Wirehair_Success) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "Failed to wirehair_recover_block with original pieces for N = "
                                    );
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,", i = ");
            goto LAB_001028ec;
          }
          __n = (ulong)blockBytes;
          if ((N - 1 == uVar4) && (__n = local_40, decodedMessage[local_40] != 0xee)) break;
          iVar2 = bcmp(__s1,decodedMessage,__n);
          if (iVar2 != 0) {
            pcVar5 = "Failed to wirehair_recover_block the data with original pieces for N = ";
            goto LAB_00102963;
          }
          uVar4 = uVar4 + 1;
          __s1 = __s1 + blockBytes;
        }
        pcVar5 = "Failed to wirehair_recover_block memory corruption with original pieces for N = ";
LAB_00102963:
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
        goto LAB_001028ec;
      }
      pcVar5 = "Failed to recover buffer overrun with original pieces for N = ";
    }
    else {
      pcVar5 = "Failed to recover the data with original pieces for N = ";
    }
  }
  else {
    pcVar5 = "Failed to recover with original pieces for N = ";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
LAB_001028ec:
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

static bool DoesCodecProduceOriginals(
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    // Check buffer overflow
    decodedMessage[messageBytes] = kPadChar;

    WirehairResult recoverResult = wirehair_recover(decoder, decodedMessage, messageBytes);

    if (recoverResult != Wirehair_Success)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover with original pieces for N = " << N << endl;
        return false;
    }

    if (0 != memcmp(message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover the data with original pieces for N = " << N << endl;
        return false;
    }

    if (decodedMessage[messageBytes] != kPadChar)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover buffer overrun with original pieces for N = " << N << endl;
        return false;
    }

    for (unsigned i = 0; i < N; ++i)
    {
        decodedMessage[finalBytes] = kPadChar;

        uint32_t recoveredBytes = 0;
        WirehairResult blockResult = wirehair_recover_block(decoder, i, decodedMessage, &recoveredBytes);

        if (blockResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block with original pieces for N = " << N << ", i = " << i << endl;
            return false;
        }

        if ((i == N - 1) && decodedMessage[finalBytes] != kPadChar)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block memory corruption with original pieces for N = " << N << endl;
            return false;
        }

        const unsigned expectedBytes = (i == N - 1) ? finalBytes : blockBytes;

        if (0 != memcmp(message + i * blockBytes, decodedMessage, expectedBytes))
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block the data with original pieces for N = " << N << endl;
            return false;
        }
    }

    return true;
}